

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O3

duckdb_logical_type
duckdb_create_struct_type
          (duckdb_logical_type *member_types_p,char **member_names,idx_t member_count)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined1 *puVar3;
  idx_t iVar4;
  LogicalType *pLVar5;
  child_list_t<duckdb::LogicalType> members;
  allocator local_d1;
  LogicalType *local_d0;
  duckdb_logical_type *local_c8;
  char **local_c0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  local_b8;
  child_list_t<LogicalType> local_a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  local_88;
  char *local_50;
  LogicalType local_48;
  
  if (member_names == (char **)0x0 || member_types_p == (duckdb_logical_type *)0x0) {
    pLVar5 = (LogicalType *)0x0;
  }
  else {
    if (member_count != 0) {
      iVar4 = 0;
      do {
        if (member_names[iVar4] == (char *)0x0) {
          return (duckdb_logical_type)0x0;
        }
        if (member_types_p[iVar4] == (duckdb_logical_type)0x0) {
          return (duckdb_logical_type)0x0;
        }
        iVar4 = iVar4 + 1;
      } while (member_count != iVar4);
    }
    local_c8 = member_types_p;
    local_c0 = member_names;
    local_d0 = (LogicalType *)operator_new(0x18);
    duckdb::LogicalType::LogicalType(local_d0);
    local_b8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (member_count != 0) {
      iVar4 = 0;
      do {
        local_50 = local_c0[iVar4];
        duckdb::LogicalType::LogicalType(&local_48,(LogicalType *)local_c8[iVar4]);
        std::__cxx11::string::string((string *)&local_88,local_50,&local_d1);
        duckdb::LogicalType::LogicalType(&local_88.second,&local_48);
        std::
        vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
        ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                  ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                    *)&local_b8,&local_88);
        duckdb::LogicalType::~LogicalType(&local_88.second);
        puVar3 = (undefined1 *)
                 CONCAT62(local_88.first._M_dataplus._M_p._2_6_,
                          CONCAT11(local_88.first._M_dataplus._M_p._1_1_,
                                   (LogicalTypeId)local_88.first._M_dataplus._M_p));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar3 != &local_88.first.field_2) {
          operator_delete(puVar3);
        }
        duckdb::LogicalType::~LogicalType(&local_48);
        iVar4 = iVar4 + 1;
      } while (member_count != iVar4);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_a0,&local_b8);
    duckdb::LogicalType::STRUCT((LogicalType *)&local_88,&local_a0);
    pLVar5 = local_d0;
    local_d0->id_ = (LogicalTypeId)local_88.first._M_dataplus._M_p;
    local_d0->physical_type_ = local_88.first._M_dataplus._M_p._1_1_;
    peVar1 = (local_d0->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (local_d0->type_info_).internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    (local_d0->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_88.first._M_string_length;
    (local_d0->type_info_).internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_88.first.field_2._M_allocated_capacity;
    local_88.first._M_string_length = (size_type)peVar1;
    local_88.first.field_2._M_allocated_capacity = (size_type)p_Var2;
    duckdb::LogicalType::~LogicalType((LogicalType *)&local_88);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_a0);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_b8);
  }
  return (duckdb_logical_type)pLVar5;
}

Assistant:

duckdb_logical_type duckdb_create_struct_type(duckdb_logical_type *member_types_p, const char **member_names,
                                              idx_t member_count) {
	if (!member_types_p || !member_names) {
		return nullptr;
	}
	duckdb::LogicalType **member_types = (duckdb::LogicalType **)member_types_p;
	for (idx_t i = 0; i < member_count; i++) {
		if (!member_names[i] || !member_types[i]) {
			return nullptr;
		}
	}

	duckdb::LogicalType *mtype = new duckdb::LogicalType;
	duckdb::child_list_t<duckdb::LogicalType> members;

	for (idx_t i = 0; i < member_count; i++) {
		members.push_back(make_pair(member_names[i], *member_types[i]));
	}
	*mtype = duckdb::LogicalType::STRUCT(members);
	return reinterpret_cast<duckdb_logical_type>(mtype);
}